

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_random(lua_State *L)

{
  int iVar1;
  int iVar2;
  double r;
  lua_Integer up;
  lua_Integer low;
  lua_State *L_local;
  
  iVar1 = rand();
  iVar2 = lua_gettop(L);
  if (iVar2 == 0) {
    lua_pushnumber(L,(double)iVar1 * 4.656612873077393e-10);
  }
  else {
    if (iVar2 == 1) {
      up = 1;
      r = (double)luaL_checkinteger(L,1);
    }
    else {
      if (iVar2 != 2) {
        iVar1 = luaL_error(L,"wrong number of arguments");
        return iVar1;
      }
      up = luaL_checkinteger(L,1);
      r = (double)luaL_checkinteger(L,2);
    }
    if ((long)r < up) {
      luaL_argerror(L,1,"interval is empty");
    }
    if ((up < 0) && (up + 0x7fffffffffffffff < (long)r)) {
      luaL_argerror(L,1,"interval too large");
    }
    lua_pushinteger(L,(long)(((double)((long)r - up) + 1.0) * (double)iVar1 * 4.656612873077393e-10)
                      + up);
  }
  return 1;
}

Assistant:

static int math_random(lua_State *L) {
    lua_Integer low, up;
    double r = (double) l_rand() * (1.0 / ((double) L_RANDMAX + 1.0));
    switch (lua_gettop(L)) {  /* check number of arguments */
        case 0: {  /* no arguments */
            lua_pushnumber(L, (lua_Number) r);  /* Number between 0 and 1 */
            return 1;
        }
        case 1: {  /* only upper limit */
            low = 1;
            up = luaL_checkinteger(L, 1);
            break;
        }
        case 2: {  /* lower and upper limits */
            low = luaL_checkinteger(L, 1);
            up = luaL_checkinteger(L, 2);
            break;
        }
        default:
            return luaL_error(L, "wrong number of arguments");
    }
    /* random integer in the interval [low, up] */
    luaL_argcheck(L, low <= up, 1, "interval is empty");
    luaL_argcheck(L, low >= 0 || up <= LUA_MAXINTEGER + low, 1,
                  "interval too large");
    r *= (double) (up - low) + 1.0;
    lua_pushinteger(L, (lua_Integer) r + low);
    return 1;
}